

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int PatchFrame(int frameNum)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  DEHSprName *pDVar7;
  spritedef_t *psVar8;
  FState *pFVar9;
  uint local_64;
  uint i;
  size_t keylen;
  undefined1 local_50 [4];
  int val;
  FState dummy;
  FState *info;
  uint local_18;
  int frame;
  int misc1;
  int tics;
  int result;
  int frameNum_local;
  
  dummy._32_8_ = FindState(frameNum);
  if ((FState *)dummy._32_8_ == (FState *)0x0) {
    dummy._32_8_ = local_50;
    info._4_4_ = 0;
    local_18 = 0;
    frame = 0;
    Printf("Frame %d out of range\n",(ulong)(uint)frameNum);
    uVar2 = info._4_4_;
    uVar1 = local_18;
  }
  else {
    DPrintf(4,"Frame %d\n",(ulong)(uint)frameNum);
    if (frameNum == 0x2f) {
      frame = 5;
    }
    else if (frameNum == 0x30) {
      frame = 4;
    }
    else {
      frame = FState::GetTics((FState *)dummy._32_8_);
    }
    uVar1 = FState::GetMisc1((FState *)dummy._32_8_);
    uVar2 = FState::GetFrame((FState *)dummy._32_8_);
    iVar3 = FState::GetFullbright((FState *)dummy._32_8_);
    uVar4 = 0;
    if (iVar3 != 0) {
      uVar4 = 0x8000;
    }
    uVar2 = uVar2 | uVar4;
  }
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            while( true ) {
              local_18 = uVar1;
              info._4_4_ = uVar2;
              iVar3 = GetLine();
              if (iVar3 != 1) {
                if ((undefined1 *)dummy._32_8_ != local_50) {
                  *(ushort *)(dummy._32_8_ + 0x1a) = *(ushort *)(dummy._32_8_ + 0x1a) | 0x40;
                  if (0x3f < (info._4_4_ & 0x7fff)) {
                    Printf("Frame %d: Subnumber must be in range [0,63]\n",(ulong)(uint)frameNum);
                  }
                  *(short *)(dummy._32_8_ + 0x14) = (short)frame;
                  *(uint *)(dummy._32_8_ + 0x20) = local_18;
                  *(byte *)(dummy._32_8_ + 0x1c) = (byte)info._4_4_ & 0x3f;
                  if ((info._4_4_ & 0x8000) == 0) {
                    *(ushort *)(dummy._32_8_ + 0x1a) = *(ushort *)(dummy._32_8_ + 0x1a) & 0xfffb;
                  }
                  else {
                    *(ushort *)(dummy._32_8_ + 0x1a) = *(ushort *)(dummy._32_8_ + 0x1a) | 4;
                  }
                }
                return iVar3;
              }
              uVar4 = atoi(Line2);
              sVar6 = strlen(Line1);
              uVar2 = info._4_4_;
              if ((sVar6 != 8) || (iVar3 = strcasecmp(Line1,"Duration"), iVar3 != 0)) break;
              frame = clamp<int>(uVar4,-1,0x7fff);
              uVar1 = local_18;
            }
          } while ((sVar6 == 9) &&
                  (iVar3 = strcasecmp(Line1,"Unknown 1"), uVar1 = uVar4, iVar3 == 0));
          if ((sVar6 != 9) || (iVar3 = strcasecmp(Line1,"Unknown 2"), iVar3 != 0)) break;
          *(uint *)(dummy._32_8_ + 0x24) = uVar4;
          uVar1 = local_18;
        }
        if ((sVar6 == 0xd) && (iVar3 = strcasecmp(Line1,"Sprite number"), iVar3 == 0)) break;
        if ((sVar6 == 10) && (iVar3 = strcasecmp(Line1,"Next frame"), iVar3 == 0)) {
          pFVar9 = FindState(uVar4);
          *(FState **)dummy._32_8_ = pFVar9;
          uVar1 = local_18;
        }
        else if ((sVar6 != 0x10) ||
                (iVar3 = strcasecmp(Line1,"Sprite subnumber"), uVar2 = uVar4, uVar1 = local_18,
                iVar3 != 0)) {
          Printf(unknown_str,Line1,"Frame",(ulong)(uint)frameNum);
          uVar2 = info._4_4_;
          uVar1 = local_18;
        }
      }
      uVar1 = TArray<DEHSprName,_DEHSprName>::Size(&OrgSprNames);
      if ((int)uVar4 < (int)uVar1) break;
      Printf("Frame %d: Sprite %d out of range\n",(ulong)(uint)frameNum,(ulong)uVar4);
      uVar1 = local_18;
    }
    for (local_64 = 0; uVar1 = TArray<spritedef_t,_spritedef_t>::Size(&sprites), local_64 < uVar1;
        local_64 = local_64 + 1) {
      pDVar7 = TArray<DEHSprName,_DEHSprName>::operator[](&OrgSprNames,(long)(int)uVar4);
      psVar8 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(ulong)local_64);
      if (*(DWORD *)pDVar7->c == (psVar8->field_0).dwName) {
        *(uint *)(dummy._32_8_ + 0x10) = local_64;
        break;
      }
    }
    uVar5 = TArray<spritedef_t,_spritedef_t>::Size(&sprites);
    uVar1 = local_18;
    if (local_64 == uVar5) {
      pDVar7 = TArray<DEHSprName,_DEHSprName>::operator[](&OrgSprNames,(long)(int)uVar4);
      Printf("Frame %d: Sprite %d (%s) is undefined\n",(ulong)(uint)frameNum,(ulong)uVar4,pDVar7);
    }
  } while( true );
}

Assistant:

static int PatchFrame (int frameNum)
{
	int result;
	int tics, misc1, frame;
	FState *info, dummy;

	info = FindState (frameNum);
	if (info)
	{
		DPrintf (DMSG_SPAMMY, "Frame %d\n", frameNum);
		if (frameNum == 47)
		{ // Use original tics for S_DSGUNFLASH1
			tics = 5;
		}
		else if (frameNum == 48)
		{ // Ditto for S_DSGUNFLASH2
			tics = 4;
		}
		else
		{
			tics = info->GetTics ();
		}
		misc1 = info->GetMisc1 ();
		frame = info->GetFrame () | (info->GetFullbright() ? 0x8000 : 0);
	}
	else
	{
		info = &dummy;
		tics = misc1 = frame = 0;
		Printf ("Frame %d out of range\n", frameNum);
	}

	while ((result = GetLine ()) == 1)
	{
		int val = atoi (Line2);
		size_t keylen = strlen (Line1);

		if (keylen == 8 && stricmp (Line1, "Duration") == 0)
		{
			tics = clamp (val, -1, SHRT_MAX);
		}
		else if (keylen == 9 && stricmp (Line1, "Unknown 1") == 0)
		{
			misc1 = val;
		}
		else if (keylen == 9 && stricmp (Line1, "Unknown 2") == 0)
		{
			info->Misc2 = val;
		}
		else if (keylen == 13 && stricmp (Line1, "Sprite number") == 0)
		{
			unsigned int i;

			if (val < (int)OrgSprNames.Size())
			{
				for (i = 0; i < sprites.Size(); i++)
				{
					if (memcmp (OrgSprNames[val].c, sprites[i].name, 4) == 0)
					{
						info->sprite = (int)i;
						break;
					}
				}
				if (i == sprites.Size ())
				{
					Printf ("Frame %d: Sprite %d (%s) is undefined\n",
						frameNum, val, OrgSprNames[val].c);
				}
			}
			else
			{
				Printf ("Frame %d: Sprite %d out of range\n", frameNum, val);
			}
		}
		else if (keylen == 10 && stricmp (Line1, "Next frame") == 0)
		{
			info->NextState = FindState (val);
		}
		else if (keylen == 16 && stricmp (Line1, "Sprite subnumber") == 0)
		{
			frame = val;
		}
		else
		{
			Printf (unknown_str, Line1, "Frame", frameNum);
		}
	}

	if (info != &dummy)
	{
		info->StateFlags |= STF_DEHACKED;	// Signals the state has been modified by dehacked
		if ((unsigned)(frame & 0x7fff) > 63)
		{
			Printf("Frame %d: Subnumber must be in range [0,63]\n", frameNum);
		}
		info->Tics = tics;
		info->Misc1 = misc1;
		info->Frame = frame & 0x3f;
		if (frame & 0x8000) info->StateFlags |= STF_FULLBRIGHT;
		else info->StateFlags &= ~STF_FULLBRIGHT;
	}

	return result;
}